

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Optimizer::Optimizer(Optimizer *this,Optimizer *from)

{
  OptimizerTypeCase OVar1;
  SGDOptimizer *this_00;
  SGDOptimizer *from_00;
  AdamOptimizer *this_01;
  AdamOptimizer *from_01;
  Optimizer *from_local;
  Optimizer *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Optimizer_006f8528;
  OptimizerTypeUnion::OptimizerTypeUnion((OptimizerTypeUnion *)&this->OptimizerType_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  clear_has_OptimizerType(this);
  OVar1 = OptimizerType_case(from);
  if (OVar1 != OPTIMIZERTYPE_NOT_SET) {
    if (OVar1 == kSgdOptimizer) {
      this_00 = _internal_mutable_sgdoptimizer(this);
      from_00 = _internal_sgdoptimizer(from);
      SGDOptimizer::MergeFrom(this_00,from_00);
    }
    else if (OVar1 == kAdamOptimizer) {
      this_01 = _internal_mutable_adamoptimizer(this);
      from_01 = _internal_adamoptimizer(from);
      AdamOptimizer::MergeFrom(this_01,from_01);
    }
  }
  return;
}

Assistant:

Optimizer::Optimizer(const Optimizer& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  clear_has_OptimizerType();
  switch (from.OptimizerType_case()) {
    case kSgdOptimizer: {
      _internal_mutable_sgdoptimizer()->::CoreML::Specification::SGDOptimizer::MergeFrom(from._internal_sgdoptimizer());
      break;
    }
    case kAdamOptimizer: {
      _internal_mutable_adamoptimizer()->::CoreML::Specification::AdamOptimizer::MergeFrom(from._internal_adamoptimizer());
      break;
    }
    case OPTIMIZERTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Optimizer)
}